

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_psllw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  byte bVar1;
  
  if (0xf < s->_q_ZMMReg[0]) {
    d->_q_ZMMReg[0] = 0;
    d->_q_ZMMReg[1] = 0;
    return;
  }
  bVar1 = s->_b_ZMMReg[0];
  d->_w_ZMMReg[0] = (uint16_t)(d->_l_ZMMReg[0] << (bVar1 & 0x1f));
  d->_w_ZMMReg[1] = d->_w_ZMMReg[1] << (bVar1 & 0x1f);
  d->_w_ZMMReg[2] = (uint16_t)(d->_l_ZMMReg[1] << (bVar1 & 0x1f));
  d->_w_ZMMReg[3] = d->_w_ZMMReg[3] << (bVar1 & 0x1f);
  d->_w_ZMMReg[4] = (uint16_t)(d->_l_ZMMReg[2] << (bVar1 & 0x1f));
  d->_w_ZMMReg[5] = d->_w_ZMMReg[5] << (bVar1 & 0x1f);
  d->_w_ZMMReg[6] = (uint16_t)(d->_l_ZMMReg[3] << (bVar1 & 0x1f));
  d->_w_ZMMReg[7] = d->_w_ZMMReg[7] << (bVar1 & 0x1f);
  return;
}

Assistant:

void glue(helper_psllw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->W(0) <<= shift;
        d->W(1) <<= shift;
        d->W(2) <<= shift;
        d->W(3) <<= shift;
#if SHIFT == 1
        d->W(4) <<= shift;
        d->W(5) <<= shift;
        d->W(6) <<= shift;
        d->W(7) <<= shift;
#endif
    }
}